

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O0

void __thiscall
ServerService::startBroadcast(ServerService *this,sockaddr_in *peerAddr,char *msg,int sleepSecond)

{
  ssize_t sVar1;
  ostream *poVar2;
  int sleepSecond_local;
  char *msg_local;
  sockaddr_in *peerAddr_local;
  ServerService *this_local;
  
  sVar1 = sendto(this->broadcastFD,msg,8,0,(sockaddr *)peerAddr,0x10);
  if (sVar1 == -1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Send Broadcast Error");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Send Broadcast Success");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  sleep(sleepSecond);
  return;
}

Assistant:

void ServerService::startBroadcast(struct sockaddr_in *peerAddr, char* msg, int sleepSecond) {
    //    char msg[100] = "Msg from udp broadcast client!";
    if (-1 != sendto(broadcastFD, msg, sizeof(msg), 0, (struct sockaddr *) peerAddr, sizeof(struct sockaddr_in))) {
        cout << "Send Broadcast Success" << endl;
    } else {
        cout << "Send Broadcast Error" << endl;
    }
    sleep(sleepSecond);
}